

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

ParserResult * __thiscall
Catch::Clara::Detail::
BoundFlagLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:2873:18)>
::setFlag(ParserResult *__return_storage_ptr__,
         BoundFlagLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:2873:18)>
         *this,bool flag)

{
  undefined1 local_19 [8];
  bool flag_local;
  BoundFlagLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:2873:18)>
  *this_local;
  
  local_19[0] = flag;
  unique0x1000003c = this;
  this_local = (BoundFlagLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:2873:18)>
                *)__return_storage_ptr__;
  LambdaInvoker<Catch::Clara::Detail::BasicResult<Catch::Clara::ParseResultType>>::
  invoke<Catch::Clara::Help::Help(bool&)::__0,bool>
            (__return_storage_ptr__,
             (LambdaInvoker<Catch::Clara::Detail::BasicResult<Catch::Clara::ParseResultType>> *)
             &this->m_lambda,(anon_class_8_1_beab0a68_for_m_lambda *)local_19,
             (bool *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

auto setFlag( bool flag ) -> ParserResult override {
                    return LambdaInvoker<typename UnaryLambdaTraits<
                        L>::ReturnType>::invoke( m_lambda, flag );
                }